

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O1

void __thiscall helics::apps::Connector::processArgs(Connector *this)

{
  undefined1 this_00 [8];
  pointer *__ptr;
  unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> app;
  undefined1 local_58 [8];
  undefined1 local_50 [32];
  undefined1 local_30 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_20;
  
  generateParser((Connector *)local_58);
  if ((this->super_App).deactivated == false) {
    helicsCLI11App::
    helics_parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
              ((helicsCLI11App *)local_58,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&(this->super_App).remArgs);
  }
  else if ((this->super_App).helpMode == true) {
    helicsCLI11App::remove_helics_specifics((helicsCLI11App *)local_58);
    this_00 = local_58;
    local_50._0_8_ = (element_type *)(local_50 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
    CLI::App::help((string *)local_30,(App *)this_00,(string *)local_50,Normal);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(char *)local_30._0_8_,local_30._8_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._0_8_ != &local_20) {
      operator_delete((void *)local_30._0_8_,local_20._0_8_ + 1);
    }
    if ((element_type *)local_50._0_8_ != (element_type *)(local_50 + 0x10)) {
      operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
    }
  }
  if (local_58 != (undefined1  [8])0x0) {
    (*((App *)local_58)->_vptr_App[1])();
  }
  return;
}

Assistant:

void Connector::processArgs()
{
    auto app = generateParser();

    if (!deactivated) {
        app->helics_parse(remArgs);
    } else if (helpMode) {
        app->remove_helics_specifics();
        std::cout << app->help();
    }
}